

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest::~DiskSourceTreeTest
          (DiskSourceTreeTest *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__DiskSourceTreeTest_018d6ae0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->dirnames_);
  DiskSourceTree::~DiskSourceTree(&this->source_tree_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    dirnames_.push_back(
        absl::StrCat(TestTempDir(), "/test_proto2_import_path_1"));
    dirnames_.push_back(
        absl::StrCat(TestTempDir(), "/test_proto2_import_path_2"));

    for (int i = 0; i < dirnames_.size(); i++) {
      if (FileExists(dirnames_[i])) {
        File::DeleteRecursively(dirnames_[i], NULL, NULL);
      }
      ABSL_CHECK_OK(File::CreateDir(dirnames_[i], 0777));
    }
  }